

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appendTest.cpp
# Opt level: O0

int main(void)

{
  LinkedList *this;
  Node *local_38;
  Node *loopInstance;
  int i;
  LinkedList *test;
  Node *pNStack_18;
  int counter;
  Node *head;
  
  head._4_4_ = 0;
  pNStack_18 = (Node *)0x0;
  test._4_4_ = 1;
  this = (LinkedList *)operator_new(1);
  for (loopInstance._4_4_ = 0; loopInstance._4_4_ < 100; loopInstance._4_4_ = loopInstance._4_4_ + 1
      ) {
    LinkedList::append(this,&stack0xffffffffffffffe8,loopInstance._4_4_ + 1);
  }
  LinkedList::printList(this,pNStack_18);
  for (local_38 = pNStack_18; local_38->next != (Node *)0x0; local_38 = local_38->next) {
    test._4_4_ = test._4_4_ + 1;
  }
  if (((pNStack_18->data == 1) && (local_38->data == 100)) && (test._4_4_ == 100)) {
    head._4_4_ = 0;
  }
  else {
    head._4_4_ = 1;
  }
  return head._4_4_;
}

Assistant:

int main() {
	Node* head = nullptr;
	int counter = 1;
	LinkedList* test = new LinkedList();

	for (int i = 0; i < 100; i++) {
	 	test->append(&head, i + 1);
	}

	test->printList(head);

	Node* loopInstance = head;
	while (loopInstance->next != nullptr) {
		loopInstance = loopInstance->next;
		counter++;
	}

	if (head->data == 1 && loopInstance->data == 100 && counter == 100) {
		return 0;
	} else {
		return 1;
	}
}